

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O1

HashUtil * __thiscall cfd::core::HashUtil::operator<<(HashUtil *this,Script *script)

{
  ByteData local_30;
  
  Script::GetData(&local_30,script);
  ByteData::Push(&this->buffer_,&local_30);
  if (local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

HashUtil &HashUtil::operator<<(const Script &script) {
  buffer_.Push(script.GetData());
  return *this;
}